

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t match_flags)

{
  precise_unit un_00;
  string local_38;
  
  un_00._8_8_ = un;
  un_00.multiplier_ = *(double *)this;
  to_string_internal_abi_cxx11_(&local_38,*(units **)(this + 8),un_00,match_flags);
  clean_unit_string(__return_storage_ptr__,&local_38,*(uint32_t *)(this + 0xc));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const precise_unit& un, std::uint64_t match_flags)
{
    return clean_unit_string(
        to_string_internal(un, match_flags), un.commodity());
}